

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void convolve_add_src_vert_hip
               (uint16_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               InterpKernel *y_filters,int y0_q4,int y_step_q4,int w,int h,int round1_bits)

{
  ushort uVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  uint16_t *a;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int sum;
  int rounding;
  int16_t *y_filter;
  uint16_t *src_y;
  int in_stack_00000018;
  int y;
  int y_q4;
  int x;
  int bd;
  int local_3c;
  uint local_38;
  int local_34;
  long local_18;
  long local_8;
  
  local_8 = in_RDI + in_RSI * -6;
  local_18 = in_RDX;
  for (local_34 = 0; local_34 < (int)src_y; local_34 = local_34 + 1) {
    local_38 = in_R9D;
    for (local_3c = 0; local_3c < in_stack_00000018; local_3c = local_3c + 1) {
      a = (uint16_t *)(local_8 + ((int)local_38 >> 4) * in_RSI * 2);
      uVar1 = a[in_RSI * 3];
      bVar2 = (byte)y_q4;
      iVar4 = highbd_vert_scalar_product
                        (a,in_RSI,(int16_t *)(in_R8 + (long)(int)(local_38 & 0xf) * 0x10));
      uVar3 = clip_pixel((int)(iVar4 + ((uint)uVar1 * 0x80 - (1 << (bVar2 + 7 & 0x1f))) +
                              ((1 << (bVar2 & 0x1f)) >> 1)) >> (bVar2 & 0x1f));
      *(uint8_t *)(local_18 + local_3c * in_RCX) = uVar3;
      local_38 = (int)y_filter + local_38;
    }
    local_8 = local_8 + 2;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void convolve_add_src_vert_hip(const uint16_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const InterpKernel *y_filters, int y0_q4,
                                      int y_step_q4, int w, int h,
                                      int round1_bits) {
  const int bd = 8;
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);

  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const uint16_t *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int rounding =
          ((int)src_y[(SUBPEL_TAPS / 2 - 1) * src_stride] << FILTER_BITS) -
          (1 << (bd + round1_bits - 1));
      const int sum =
          highbd_vert_scalar_product(src_y, src_stride, y_filter) + rounding;
      dst[y * dst_stride] = clip_pixel(ROUND_POWER_OF_TWO(sum, round1_bits));
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}